

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

void __thiscall
cmGeneratorTarget::GetTargetVersion
          (cmGeneratorTarget *this,bool soversion,int *major,int *minor,int *patch)

{
  TargetType TVar1;
  int iVar2;
  char *pcVar3;
  undefined4 local_80;
  int local_7c;
  int parsed_patch;
  int parsed_minor;
  int parsed_major;
  allocator<char> local_61;
  string local_60;
  char *local_40;
  char *version;
  char *prop;
  int *patch_local;
  int *minor_local;
  int *major_local;
  cmGeneratorTarget *pcStack_10;
  bool soversion_local;
  cmGeneratorTarget *this_local;
  
  *major = 0;
  *minor = 0;
  *patch = 0;
  prop = (char *)patch;
  patch_local = minor;
  minor_local = major;
  major_local._7_1_ = soversion;
  pcStack_10 = this;
  TVar1 = GetType(this);
  if (TVar1 == INTERFACE_LIBRARY) {
    __assert_fail("this->GetType() != cmStateEnums::INTERFACE_LIBRARY",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmGeneratorTarget.cxx"
                  ,0x12be,
                  "void cmGeneratorTarget::GetTargetVersion(bool, int &, int &, int &) const");
  }
  pcVar3 = "VERSION";
  if ((major_local._7_1_ & 1) != 0) {
    pcVar3 = "SOVERSION";
  }
  version = pcVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,pcVar3,&local_61);
  pcVar3 = GetProperty(this,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator(&local_61);
  if (pcVar3 != (char *)0x0) {
    local_40 = pcVar3;
    iVar2 = __isoc99_sscanf(pcVar3,"%d.%d.%d",&parsed_patch,&local_7c,&local_80);
    if (iVar2 != 1) {
      if (iVar2 != 2) {
        if (iVar2 != 3) {
          return;
        }
        *(undefined4 *)prop = local_80;
      }
      *patch_local = local_7c;
    }
    *minor_local = parsed_patch;
  }
  return;
}

Assistant:

void cmGeneratorTarget::GetTargetVersion(bool soversion, int& major,
                                         int& minor, int& patch) const
{
  // Set the default values.
  major = 0;
  minor = 0;
  patch = 0;

  assert(this->GetType() != cmStateEnums::INTERFACE_LIBRARY);

  // Look for a VERSION or SOVERSION property.
  const char* prop = soversion ? "SOVERSION" : "VERSION";
  if (const char* version = this->GetProperty(prop)) {
    // Try to parse the version number and store the results that were
    // successfully parsed.
    int parsed_major;
    int parsed_minor;
    int parsed_patch;
    switch (sscanf(version, "%d.%d.%d", &parsed_major, &parsed_minor,
                   &parsed_patch)) {
      case 3:
        patch = parsed_patch;
        CM_FALLTHROUGH;
      case 2:
        minor = parsed_minor;
        CM_FALLTHROUGH;
      case 1:
        major = parsed_major;
        CM_FALLTHROUGH;
      default:
        break;
    }
  }
}